

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.cpp
# Opt level: O3

double __thiscall PointLight::getShadowRatio(PointLight *this,Scene *scene,Vector3 *p)

{
  pointer ppOVar1;
  double dVar2;
  Vector3 dir;
  Collision coll;
  Vector3 local_c0;
  undefined1 local_a8 [112];
  double local_38;
  
  operator-(&this->m_o,p);
  dVar2 = Vector3::mod(&local_c0);
  ppOVar1 = (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar1 !=
      (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (*(*ppOVar1)->_vptr_Object[2])(local_a8,*ppOVar1,p,&local_c0);
      if ((local_38 < 1000000000.0) && (local_38 + 1e-06 < dVar2)) {
        return 0.0;
      }
      ppOVar1 = ppOVar1 + 1;
    } while (ppOVar1 !=
             (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return 1.0;
}

Assistant:

double PointLight::getShadowRatio(const Scene* scene, const Vector3& p) const
{
    Vector3 dir = m_o - p;
    double dist = dir.mod();
    for (auto o = scene->objectsBegin(); o != scene->objectsEnd(); o++)
    {
        Collision coll = (*o)->collide(p, dir);
        if (coll.isHit() && coll.dist + Const::EPS < dist) return 0;
    }
    return 1;
}